

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O0

void slot_write20(opl_slot *slot,Bit8u data)

{
  Bit8u data_local;
  opl_slot *slot_local;
  
  if ((int)(uint)data >> 7 == 0) {
    slot->trem = (Bit8u *)&slot->chip->zeromod;
  }
  else {
    slot->trem = &slot->chip->tremval;
  }
  slot->reg_vib = (byte)((int)(uint)data >> 6) & 1;
  slot->reg_type = (byte)((int)(uint)data >> 5) & 1;
  slot->reg_ksr = (byte)((int)(uint)data >> 4) & 1;
  slot->reg_mult = data & 0xf;
  envelope_update_rate(slot);
  return;
}

Assistant:

void slot_write20(opl_slot *slot, Bit8u data) {
	if ((data >> 7) & 0x01) {
		slot->trem = &slot->chip->tremval;
	}
	else {
		slot->trem = (Bit8u*)&slot->chip->zeromod;
	}
	slot->reg_vib = (data >> 6) & 0x01;
	slot->reg_type = (data >> 5) & 0x01;
	slot->reg_ksr = (data >> 4) & 0x01;
	slot->reg_mult = data & 0x0f;
	envelope_update_rate(slot);
}